

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchClass.c
# Opt level: O3

void Dch_ClassesPrepare(Dch_Cla_t *p,int fLatchCorr,int nMaxLevs)

{
  int *piVar1;
  Aig_Obj_t *pAVar2;
  int *piVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  void *__ptr;
  void *__ptr_00;
  Aig_Obj_t **ppAVar7;
  int iVar8;
  uint uVar9;
  long lVar10;
  long lVar11;
  Aig_Man_t *pAVar12;
  long lVar13;
  Aig_Obj_t *pAVar14;
  Aig_Obj_t **ppAVar15;
  ulong uVar16;
  long lVar17;
  uint uVar18;
  Vec_Ptr_t *pVVar19;
  int local_44;
  
  pAVar12 = p->pAig;
  pVVar19 = pAVar12->vObjs;
  iVar6 = pVVar19->nSize;
  iVar8 = iVar6 + 3;
  if (-1 < (long)iVar6) {
    iVar8 = iVar6;
  }
  uVar9 = (iVar8 >> 2) - 1;
  while( true ) {
    do {
      uVar18 = uVar9 + 1;
      uVar5 = uVar9 & 1;
      uVar9 = uVar18;
    } while (uVar5 != 0);
    if (uVar18 < 9) break;
    iVar8 = 5;
    while (uVar18 % (iVar8 - 2U) != 0) {
      uVar5 = iVar8 * iVar8;
      iVar8 = iVar8 + 2;
      if (uVar18 < uVar5) goto LAB_005bb8d7;
    }
  }
LAB_005bb8d7:
  __ptr = calloc((long)(int)uVar18,8);
  __ptr_00 = calloc((long)iVar6,8);
  if (iVar6 < 1) {
    bVar4 = false;
    local_44 = 0;
  }
  else {
    lVar17 = 0;
    local_44 = 0;
    do {
      pAVar2 = (Aig_Obj_t *)pVVar19->pArray[lVar17];
      if (pAVar2 != (Aig_Obj_t *)0x0) {
        uVar9 = (uint)*(undefined8 *)&pAVar2->field_0x18;
        if (fLatchCorr == 0) {
          uVar9 = uVar9 & 7;
          if (((uVar9 == 2) || (uVar9 - 5 < 2)) &&
             ((nMaxLevs == 0 ||
              ((int)((uint)((ulong)*(undefined8 *)&pAVar2->field_0x18 >> 0x20) & 0xffffff) <
               nMaxLevs)))) goto LAB_005bb936;
        }
        else if ((uVar9 & 7) == 2) {
LAB_005bb936:
          iVar6 = (*p->pFuncNodeIsConst)(p->pManData,pAVar2);
          if (iVar6 == 0) {
            uVar9 = (*p->pFuncNodeHash)(p->pManData,pAVar2);
            pAVar14 = *(Aig_Obj_t **)((long)__ptr + (long)(int)(uVar9 % uVar18) * 8);
            if (pAVar14 == (Aig_Obj_t *)0x0) {
              *(Aig_Obj_t **)((long)__ptr + (long)(int)(uVar9 % uVar18) * 8) = pAVar2;
            }
            else {
              ppAVar7 = p->pAig->pReprs;
              if (ppAVar7 == (Aig_Obj_t **)0x0) goto LAB_005bbc32;
              lVar11 = (long)pAVar2->Id;
              ppAVar7[lVar11] = pAVar14;
              lVar10 = (long)pAVar14->Id;
              lVar13 = *(long *)((long)__ptr_00 + lVar10 * 8);
              piVar3 = p->pClassSizes;
              if (lVar13 == 0) {
                piVar1 = piVar3 + lVar10;
                *piVar1 = *piVar1 + 1;
                local_44 = local_44 + 1;
                lVar10 = (long)pAVar14->Id;
                lVar13 = *(long *)((long)__ptr_00 + lVar10 * 8);
                lVar11 = (long)pAVar2->Id;
              }
              *(long *)((long)__ptr_00 + lVar11 * 8) = lVar13;
              *(Aig_Obj_t **)((long)__ptr_00 + lVar10 * 8) = pAVar2;
              piVar3 = piVar3 + lVar10;
              *piVar3 = *piVar3 + 1;
              local_44 = local_44 + 1;
            }
          }
          else {
            pAVar12 = p->pAig;
            ppAVar7 = pAVar12->pReprs;
            if (ppAVar7 == (Aig_Obj_t **)0x0) {
              if (pAVar12->pConst1 != (Aig_Obj_t *)0x0) {
LAB_005bbc32:
                __assert_fail("p->pReprs",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aig.h"
                              ,0x14b,"void Aig_ObjSetRepr(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
              }
LAB_005bbbb6:
              __assert_fail("!Dch_ObjIsConst1Cand( pAig, pObj )",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/dch/dchInt.h"
                            ,0x72,"void Dch_ObjSetConst1Cand(Aig_Man_t *, Aig_Obj_t *)");
            }
            if (ppAVar7[pAVar2->Id] == pAVar12->pConst1) goto LAB_005bbbb6;
            ppAVar7[pAVar2->Id] = pAVar12->pConst1;
            p->nCands1 = p->nCands1 + 1;
          }
        }
      }
      lVar17 = lVar17 + 1;
      pAVar12 = p->pAig;
      pVVar19 = pAVar12->vObjs;
    } while (lVar17 < pVVar19->nSize);
    bVar4 = 0 < pVVar19->nSize;
  }
  ppAVar7 = (Aig_Obj_t **)malloc(((long)p->nCands1 + (long)local_44) * 8);
  p->pMemClasses = ppAVar7;
  p->pMemClassesFree = ppAVar7 + local_44;
  iVar6 = 0;
  if (bVar4) {
    lVar17 = 0;
    uVar16 = 0;
    do {
      pAVar2 = (Aig_Obj_t *)pVVar19->pArray[lVar17];
      if ((pAVar2 != (Aig_Obj_t *)0x0) &&
         ((uVar9 = *(uint *)&pAVar2->field_0x18 & 7, uVar9 == 2 || (uVar9 - 5 < 2)))) {
        lVar13 = (long)pAVar2->Id;
        uVar9 = p->pClassSizes[lVar13];
        if ((ulong)uVar9 != 0) {
          if ((int)uVar9 < 2) {
            __assert_fail("nNodes > 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/dch/dchClass.c"
                          ,0x199,"void Dch_ClassesPrepare(Dch_Cla_t *, int, int)");
          }
          ppAVar7 = p->pMemClasses;
          ppAVar7[uVar16] = pAVar2;
          pAVar14 = *(Aig_Obj_t **)((long)__ptr_00 + lVar13 * 8);
          if (pAVar14 != (Aig_Obj_t *)0x0) {
            ppAVar15 = ppAVar7 + uVar16 + uVar9;
            do {
              ppAVar15 = ppAVar15 + -1;
              *ppAVar15 = pAVar14;
              pAVar14 = *(Aig_Obj_t **)((long)__ptr_00 + (long)pAVar14->Id * 8);
            } while (pAVar14 != (Aig_Obj_t *)0x0);
          }
          p->pClassSizes[lVar13] = 0;
          iVar6 = pAVar2->Id;
          if (p->pId2Class[iVar6] != (Aig_Obj_t **)0x0) {
            __assert_fail("p->pId2Class[pRepr->Id] == NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/dch/dchClass.c"
                          ,0x5c,"void Dch_ObjAddClass(Dch_Cla_t *, Aig_Obj_t *, Aig_Obj_t **, int)")
            ;
          }
          p->pId2Class[iVar6] = ppAVar7 + uVar16;
          if (p->pClassSizes[iVar6] != 0) {
            __assert_fail("p->pClassSizes[pRepr->Id] == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/dch/dchClass.c"
                          ,0x5e,"void Dch_ObjAddClass(Dch_Cla_t *, Aig_Obj_t *, Aig_Obj_t **, int)")
            ;
          }
          p->pClassSizes[iVar6] = uVar9;
          p->nClasses = p->nClasses + 1;
          p->nLits = p->nLits + uVar9 + -1;
          uVar16 = (ulong)((int)uVar16 + uVar9);
          pAVar12 = p->pAig;
        }
      }
      iVar6 = (int)uVar16;
      lVar17 = lVar17 + 1;
      pVVar19 = pAVar12->vObjs;
    } while (lVar17 < pVVar19->nSize);
  }
  if (local_44 != iVar6) {
    __assert_fail("nEntries == nEntries2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/dch/dchClass.c"
                  ,0x1a8,"void Dch_ClassesPrepare(Dch_Cla_t *, int, int)");
  }
  if (__ptr != (void *)0x0) {
    free(__ptr);
  }
  if (__ptr_00 != (void *)0x0) {
    free(__ptr_00);
  }
  Dch_ClassesRefine(p);
  Dch_ClassesCheck(p);
  return;
}

Assistant:

void Dch_ClassesPrepare( Dch_Cla_t * p, int fLatchCorr, int nMaxLevs )
{
    Aig_Obj_t ** ppTable, ** ppNexts, ** ppClassNew;
    Aig_Obj_t * pObj, * pTemp, * pRepr;
    int i, k, nTableSize, nNodes, iEntry, nEntries, nEntries2;

    // allocate the hash table hashing simulation info into nodes
    nTableSize = Abc_PrimeCudd( Aig_ManObjNumMax(p->pAig)/4 );
    ppTable = ABC_CALLOC( Aig_Obj_t *, nTableSize ); 
    ppNexts = ABC_CALLOC( Aig_Obj_t *, Aig_ManObjNumMax(p->pAig) ); 

    // add all the nodes to the hash table
    nEntries = 0;
    Aig_ManForEachObj( p->pAig, pObj, i )
    {
        if ( fLatchCorr )
        {
            if ( !Aig_ObjIsCi(pObj) )
                continue;
        }
        else
        {
            if ( !Aig_ObjIsNode(pObj) && !Aig_ObjIsCi(pObj) )
                continue;
            // skip the node with more that the given number of levels
            if ( nMaxLevs && (int)pObj->Level >= nMaxLevs )
                continue;
        }
        // check if the node belongs to the class of constant 1
        if ( p->pFuncNodeIsConst( p->pManData, pObj ) )
        {
            Dch_ObjSetConst1Cand( p->pAig, pObj );
            p->nCands1++;
            continue;
        }
        // hash the node by its simulation info
        iEntry = p->pFuncNodeHash( p->pManData, pObj ) % nTableSize;
        // add the node to the class
        if ( ppTable[iEntry] == NULL )
            ppTable[iEntry] = pObj;
        else
        {
            // set the representative of this node
            pRepr = ppTable[iEntry];
            Aig_ObjSetRepr( p->pAig, pObj, pRepr );
            // add node to the table
            if ( Dch_ObjNext( ppNexts, pRepr ) == NULL )
            { // this will be the second entry
                p->pClassSizes[pRepr->Id]++;
                nEntries++;
            }
            // add the entry to the list
            Dch_ObjSetNext( ppNexts, pObj, Dch_ObjNext( ppNexts, pRepr ) );
            Dch_ObjSetNext( ppNexts, pRepr, pObj );
            p->pClassSizes[pRepr->Id]++;
            nEntries++;
        }
    }

    // allocate room for classes
    p->pMemClasses = ABC_ALLOC( Aig_Obj_t *, nEntries + p->nCands1 );
    p->pMemClassesFree = p->pMemClasses + nEntries;
 
    // copy the entries into storage in the topological order
    nEntries2 = 0;
    Aig_ManForEachObj( p->pAig, pObj, i )
    {
        if ( !Aig_ObjIsNode(pObj) && !Aig_ObjIsCi(pObj) )
            continue;
        nNodes = p->pClassSizes[pObj->Id];
        // skip the nodes that are not representatives of non-trivial classes
        if ( nNodes == 0 )
            continue;
        assert( nNodes > 1 );
        // add the nodes to the class in the topological order
        ppClassNew = p->pMemClasses + nEntries2;
        ppClassNew[0] = pObj;
        for ( pTemp = Dch_ObjNext(ppNexts, pObj), k = 1; pTemp; 
              pTemp = Dch_ObjNext(ppNexts, pTemp), k++ )
        {
            ppClassNew[nNodes-k] = pTemp;
        }
        // add the class of nodes
        p->pClassSizes[pObj->Id] = 0;
        Dch_ObjAddClass( p, pObj, ppClassNew, nNodes );
        // increment the number of entries
        nEntries2 += nNodes;
    }
    assert( nEntries == nEntries2 );
    ABC_FREE( ppTable );
    ABC_FREE( ppNexts );
    // now it is time to refine the classes
    Dch_ClassesRefine( p );
    Dch_ClassesCheck( p );
}